

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O1

mraa_result_t mraa_intel_edison_miniboard(mraa_board_t *b)

{
  mraa_pininfo_t *pmVar1;
  mraa_adv_func_t *pmVar2;
  long lVar3;
  char *pcVar4;
  mraa_result_t mVar5;
  
  miniboard = 1;
  b->phy_pin_count = 0x38;
  b->gpio_count = 0x38;
  b->aio_count = 0;
  b->pwm_default_period = 5000;
  b->pwm_max_period = 0x35555;
  b->pwm_min_period = 1;
  pmVar1 = (mraa_pininfo_t *)calloc(0x38,0x2f4);
  b->pins = pmVar1;
  mVar5 = MRAA_ERROR_UNSPECIFIED;
  if (pmVar1 != (mraa_pininfo_t *)0x0) {
    pmVar2 = (mraa_adv_func_t *)calloc(1,0x288);
    b->adv_func = pmVar2;
    if (pmVar2 == (mraa_adv_func_t *)0x0) {
      free(pmVar1);
    }
    else {
      pmVar2->gpio_init_post = mraa_intel_edison_gpio_init_post;
      pmVar2->pwm_init_pre = mraa_intel_edison_pwm_init_pre;
      pmVar2->pwm_enable_pre = mraa_intel_edison_pwm_enable_pre;
      pmVar2->pwm_write_pre = mraa_intel_edison_pwm_write_pre;
      pmVar2->i2c_init_pre = mraa_intel_edison_i2c_init_pre;
      pmVar2->i2c_set_frequency_replace = mraa_intel_edison_i2c_freq;
      pmVar2->spi_init_pre = mraa_intel_edison_spi_init_pre;
      pmVar2->gpio_mode_replace = mraa_intel_edison_mb_gpio_mode;
      pmVar2->uart_init_pre = mraa_intel_edison_uart_init_pre;
      pmVar2->gpio_mmap_setup = mraa_intel_edison_mmap_setup;
      builtin_strncpy(pmVar1->name,"J17-1",6);
      pmVar1->name[6] = '\0';
      pmVar1->name[7] = '\0';
      *(undefined1 *)&pmVar1->capabilities = 7;
      (pmVar1->gpio).pinmap = 0xb6;
      (pmVar1->gpio).mux_total = 0;
      (pmVar1->pwm).pinmap = 2;
      (pmVar1->pwm).parent_id = 0;
      (pmVar1->pwm).mux_total = 0;
      pmVar1[1].name[0] = 'J';
      pmVar1[1].name[1] = '1';
      pmVar1[1].name[2] = '7';
      pmVar1[1].name[3] = '-';
      pmVar1[1].name[4] = '2';
      pmVar1[1].name[5] = '\0';
      pmVar1[1].name[6] = '\0';
      pmVar1[1].name[7] = '\0';
      *(undefined1 *)&pmVar1[1].capabilities = 1;
      pmVar1[2].name[0] = 'J';
      pmVar1[2].name[1] = '1';
      pmVar1[2].name[2] = '7';
      pmVar1[2].name[3] = '-';
      pmVar1[2].name[4] = '3';
      pmVar1[2].name[5] = '\0';
      pmVar1[2].name[6] = '\0';
      pmVar1[2].name[7] = '\0';
      *(undefined1 *)&pmVar1[2].capabilities = 1;
      pmVar1[3].name[0] = 'J';
      pmVar1[3].name[1] = '1';
      pmVar1[3].name[2] = '7';
      pmVar1[3].name[3] = '-';
      pmVar1[3].name[4] = '4';
      pmVar1[3].name[5] = '\0';
      pmVar1[3].name[6] = '\0';
      pmVar1[3].name[7] = '\0';
      *(undefined1 *)&pmVar1[3].capabilities = 1;
      pmVar1[4].name[0] = 'J';
      pmVar1[4].name[1] = '1';
      pmVar1[4].name[2] = '7';
      pmVar1[4].name[3] = '-';
      pmVar1[4].name[4] = '5';
      pmVar1[4].name[5] = '\0';
      pmVar1[4].name[6] = '\0';
      pmVar1[4].name[7] = '\0';
      *(undefined1 *)&pmVar1[4].capabilities = 3;
      pmVar1[4].gpio.pinmap = 0x87;
      pmVar1[4].gpio.mux_total = 0;
      pmVar1[5].name[0] = 'J';
      pmVar1[5].name[1] = '1';
      pmVar1[5].name[2] = '7';
      pmVar1[5].name[3] = '-';
      pmVar1[5].name[4] = '6';
      pmVar1[5].name[5] = '\0';
      pmVar1[5].name[6] = '\0';
      pmVar1[5].name[7] = '\0';
      *(undefined1 *)&pmVar1[5].capabilities = 1;
      pmVar1[6].name[0] = 'J';
      pmVar1[6].name[1] = '1';
      pmVar1[6].name[2] = '7';
      pmVar1[6].name[3] = '-';
      pmVar1[6].name[4] = '7';
      pmVar1[6].name[5] = '\0';
      pmVar1[6].name[6] = '\0';
      pmVar1[6].name[7] = '\0';
      *(undefined1 *)&pmVar1[6].capabilities = 0x23;
      pmVar1[6].gpio.pinmap = 0x1b;
      pmVar1[6].gpio.mux_total = 0;
      pmVar1[6].i2c.pinmap = 1;
      pmVar1[6].i2c.mux_total = 0;
      pmVar1[7].name[0] = 'J';
      pmVar1[7].name[1] = '1';
      pmVar1[7].name[2] = '7';
      pmVar1[7].name[3] = '-';
      pmVar1[7].name[4] = '8';
      pmVar1[7].name[5] = '\0';
      pmVar1[7].name[6] = '\0';
      pmVar1[7].name[7] = '\0';
      *(undefined1 *)&pmVar1[7].capabilities = 0x23;
      pmVar1[7].gpio.pinmap = 0x14;
      pmVar1[7].gpio.mux_total = 0;
      pmVar1[7].i2c.pinmap = 1;
      pmVar1[7].i2c.mux_total = 0;
      pmVar1[8].name[0] = 'J';
      pmVar1[8].name[1] = '1';
      pmVar1[8].name[2] = '7';
      pmVar1[8].name[3] = '-';
      pmVar1[8].name[4] = '9';
      pmVar1[8].name[5] = '\0';
      pmVar1[8].name[6] = '\0';
      pmVar1[8].name[7] = '\0';
      *(undefined1 *)&pmVar1[8].capabilities = 0x23;
      pmVar1[8].gpio.pinmap = 0x1c;
      pmVar1[8].gpio.mux_total = 0;
      pmVar1[8].i2c.pinmap = 1;
      pmVar1[8].i2c.mux_total = 0;
      pmVar1[9].name[0] = 'J';
      pmVar1[9].name[1] = '1';
      pmVar1[9].name[2] = '7';
      pmVar1[9].name[3] = '-';
      pmVar1[9].name[4] = '1';
      pmVar1[9].name[5] = '0';
      pmVar1[9].name[6] = '\0';
      pmVar1[9].name[7] = '\0';
      *(undefined1 *)&pmVar1[9].capabilities = 0x13;
      pmVar1[9].gpio.pinmap = 0x6f;
      pmVar1[9].gpio.mux_total = 0;
      pmVar1[9].spi.pinmap = 5;
      pmVar1[9].spi.mux_total = 0;
      pmVar1[10].name[0] = 'J';
      pmVar1[10].name[1] = '1';
      pmVar1[10].name[2] = '7';
      pmVar1[10].name[3] = '-';
      pmVar1[10].name[4] = '1';
      pmVar1[10].name[5] = '1';
      pmVar1[10].name[6] = '\0';
      pmVar1[10].name[7] = '\0';
      *(undefined1 *)&pmVar1[10].capabilities = 0x13;
      pmVar1[10].gpio.pinmap = 0x6d;
      pmVar1[10].gpio.mux_total = 0;
      pmVar1[10].spi.pinmap = 5;
      pmVar1[10].spi.mux_total = 0;
      pmVar1[0xb].name[0] = 'J';
      pmVar1[0xb].name[1] = '1';
      pmVar1[0xb].name[2] = '7';
      pmVar1[0xb].name[3] = '-';
      pmVar1[0xb].name[4] = '1';
      pmVar1[0xb].name[5] = '2';
      pmVar1[0xb].name[6] = '\0';
      pmVar1[0xb].name[7] = '\0';
      *(undefined1 *)&pmVar1[0xb].capabilities = 0x13;
      pmVar1[0xb].gpio.pinmap = 0x73;
      pmVar1[0xb].gpio.mux_total = 0;
      pmVar1[0xb].spi.pinmap = 5;
      pmVar1[0xb].spi.mux_total = 0;
      pmVar1[0xc].name[0] = 'J';
      pmVar1[0xc].name[1] = '1';
      pmVar1[0xc].name[2] = '7';
      pmVar1[0xc].name[3] = '-';
      pmVar1[0xc].name[4] = '1';
      pmVar1[0xc].name[5] = '3';
      pmVar1[0xc].name[6] = '\0';
      pmVar1[0xc].name[7] = '\0';
      *(undefined1 *)&pmVar1[0xc].capabilities = 1;
      pmVar1[0xd].name[0] = 'J';
      pmVar1[0xd].name[1] = '1';
      pmVar1[0xd].name[2] = '7';
      pmVar1[0xd].name[3] = '-';
      pmVar1[0xd].name[4] = '1';
      pmVar1[0xd].name[5] = '4';
      pmVar1[0xd].name[6] = '\0';
      pmVar1[0xd].name[7] = '\0';
      *(undefined1 *)&pmVar1[0xd].capabilities = 3;
      pmVar1[0xd].gpio.pinmap = 0x80;
      pmVar1[0xd].gpio.parent_id = 0;
      pmVar1[0xd].gpio.mux_total = 0;
      pmVar1[0xe].name[0] = 'J';
      pmVar1[0xe].name[1] = '1';
      pmVar1[0xe].name[2] = '8';
      pmVar1[0xe].name[3] = '-';
      pmVar1[0xe].name[4] = '1';
      pmVar1[0xe].name[5] = '\0';
      pmVar1[0xe].name[6] = '\0';
      pmVar1[0xe].name[7] = '\0';
      *(undefined1 *)&pmVar1[0xe].capabilities = 7;
      pmVar1[0xe].gpio.pinmap = 0xd;
      pmVar1[0xe].gpio.mux_total = 0;
      pmVar1[0xe].pwm.pinmap = 1;
      pmVar1[0xe].pwm.parent_id = 0;
      pmVar1[0xe].pwm.mux_total = 0;
      pmVar1[0xf].name[0] = 'J';
      pmVar1[0xf].name[1] = '1';
      pmVar1[0xf].name[2] = '8';
      pmVar1[0xf].name[3] = '-';
      pmVar1[0xf].name[4] = '2';
      pmVar1[0xf].name[5] = '\0';
      pmVar1[0xf].name[6] = '\0';
      pmVar1[0xf].name[7] = '\0';
      *(undefined1 *)&pmVar1[0xf].capabilities = 3;
      pmVar1[0xf].gpio.pinmap = 0xa5;
      pmVar1[0xf].gpio.mux_total = 0;
      pmVar1[0x10].name[0] = 'J';
      pmVar1[0x10].name[1] = '1';
      pmVar1[0x10].name[2] = '8';
      pmVar1[0x10].name[3] = '-';
      pmVar1[0x10].name[4] = '3';
      pmVar1[0x10].name[5] = '\0';
      pmVar1[0x10].name[6] = '\0';
      pmVar1[0x10].name[7] = '\0';
      *(undefined1 *)&pmVar1[0x10].capabilities = 1;
      pmVar1[0x11].name[0] = 'J';
      pmVar1[0x11].name[1] = '1';
      pmVar1[0x11].name[2] = '8';
      pmVar1[0x11].name[3] = '-';
      pmVar1[0x11].name[4] = '4';
      pmVar1[0x11].name[5] = '\0';
      pmVar1[0x11].name[6] = '\0';
      pmVar1[0x11].name[7] = '\0';
      *(undefined1 *)&pmVar1[0x11].capabilities = 1;
      pmVar1[0x12].name[0] = 'J';
      pmVar1[0x12].name[1] = '1';
      pmVar1[0x12].name[2] = '8';
      pmVar1[0x12].name[3] = '-';
      pmVar1[0x12].name[4] = '5';
      pmVar1[0x12].name[5] = '\0';
      pmVar1[0x12].name[6] = '\0';
      pmVar1[0x12].name[7] = '\0';
      *(undefined1 *)&pmVar1[0x12].capabilities = 1;
      pmVar1[0x13].name[0] = 'J';
      pmVar1[0x13].name[1] = '1';
      pmVar1[0x13].name[2] = '8';
      pmVar1[0x13].name[3] = '-';
      pmVar1[0x13].name[4] = '6';
      pmVar1[0x13].name[5] = '\0';
      pmVar1[0x13].name[6] = '\0';
      pmVar1[0x13].name[7] = '\0';
      *(undefined1 *)&pmVar1[0x13].capabilities = 0x23;
      pmVar1[0x13].gpio.pinmap = 0x13;
      pmVar1[0x13].gpio.mux_total = 0;
      pmVar1[0x13].i2c.pinmap = 1;
      pmVar1[0x13].i2c.mux_total = 0;
      pmVar1[0x14].name[0] = 'J';
      pmVar1[0x14].name[1] = '1';
      pmVar1[0x14].name[2] = '8';
      pmVar1[0x14].name[3] = '-';
      pmVar1[0x14].name[4] = '7';
      pmVar1[0x14].name[5] = '\0';
      pmVar1[0x14].name[6] = '\0';
      pmVar1[0x14].name[7] = '\0';
      *(undefined1 *)&pmVar1[0x14].capabilities = 7;
      pmVar1[0x14].gpio.pinmap = 0xc;
      pmVar1[0x14].gpio.mux_total = 0;
      pmVar1[0x14].pwm.pinmap = 0;
      pmVar1 = b->pins;
      pmVar1[0x14].pwm.parent_id = 0;
      pmVar1[0x14].pwm.mux_total = 0;
      pmVar1[0x15].name[0] = 'J';
      pmVar1[0x15].name[1] = '1';
      pmVar1[0x15].name[2] = '8';
      pmVar1[0x15].name[3] = '-';
      pmVar1[0x15].name[4] = '8';
      pmVar1[0x15].name[5] = '\0';
      pmVar1[0x15].name[6] = '\0';
      pmVar1[0x15].name[7] = '\0';
      *(undefined1 *)&b->pins[0x15].capabilities = 7;
      pmVar1 = b->pins;
      pmVar1[0x15].gpio.pinmap = 0xb7;
      pmVar1[0x15].gpio.mux_total = 0;
      pmVar1[0x15].pwm.pinmap = 3;
      pmVar1[0x15].pwm.parent_id = 0;
      pmVar1[0x15].pwm.mux_total = 0;
      pmVar1[0x16].name[0] = 'J';
      pmVar1[0x16].name[1] = '1';
      pmVar1[0x16].name[2] = '8';
      pmVar1[0x16].name[3] = '-';
      pmVar1[0x16].name[4] = '9';
      pmVar1[0x16].name[5] = '\0';
      pmVar1[0x16].name[6] = '\0';
      pmVar1[0x16].name[7] = '\0';
      *(undefined1 *)&b->pins[0x16].capabilities = 1;
      pmVar1 = b->pins;
      pmVar1[0x17].name[0] = 'J';
      pmVar1[0x17].name[1] = '1';
      pmVar1[0x17].name[2] = '8';
      pmVar1[0x17].name[3] = '-';
      pmVar1[0x17].name[4] = '1';
      pmVar1[0x17].name[5] = '0';
      pmVar1[0x17].name[6] = '\0';
      pmVar1[0x17].name[7] = '\0';
      *(undefined1 *)&b->pins[0x17].capabilities = 0x13;
      pmVar1 = b->pins;
      pmVar1[0x17].gpio.pinmap = 0x6e;
      pmVar1[0x17].gpio.mux_total = 0;
      pmVar1[0x17].spi.pinmap = 5;
      pmVar1[0x17].spi.mux_total = 0;
      pmVar1[0x18].name[0] = 'J';
      pmVar1[0x18].name[1] = '1';
      pmVar1[0x18].name[2] = '8';
      pmVar1[0x18].name[3] = '-';
      pmVar1[0x18].name[4] = '1';
      pmVar1[0x18].name[5] = '1';
      pmVar1[0x18].name[6] = '\0';
      pmVar1[0x18].name[7] = '\0';
      *(undefined1 *)&b->pins[0x18].capabilities = 0x13;
      pmVar1 = b->pins;
      pmVar1[0x18].gpio.pinmap = 0x72;
      pmVar1[0x18].gpio.mux_total = 0;
      pmVar1[0x18].spi.pinmap = 5;
      pmVar1[0x18].spi.mux_total = 0;
      pmVar1[0x19].name[0] = 'J';
      pmVar1[0x19].name[1] = '1';
      pmVar1[0x19].name[2] = '8';
      pmVar1[0x19].name[3] = '-';
      pmVar1[0x19].name[4] = '1';
      pmVar1[0x19].name[5] = '2';
      pmVar1[0x19].name[6] = '\0';
      pmVar1[0x19].name[7] = '\0';
      *(undefined1 *)&b->pins[0x19].capabilities = 3;
      pmVar1 = b->pins;
      pmVar1[0x19].gpio.pinmap = 0x81;
      pmVar1[0x19].gpio.mux_total = 0;
      pmVar1[0x1a].name[0] = 'J';
      pmVar1[0x1a].name[1] = '1';
      pmVar1[0x1a].name[2] = '8';
      pmVar1[0x1a].name[3] = '-';
      pmVar1[0x1a].name[4] = '1';
      pmVar1[0x1a].name[5] = '3';
      pmVar1[0x1a].name[6] = '\0';
      pmVar1[0x1a].name[7] = '\0';
      *(undefined1 *)&b->pins[0x1a].capabilities = 0x83;
      pmVar1 = b->pins;
      pmVar1[0x1a].gpio.pinmap = 0x82;
      pmVar1[0x1a].gpio.mux_total = 0;
      pmVar1[0x1a].uart.pinmap = 0;
      pmVar1[0x1a].uart.parent_id = 0;
      pmVar1[0x1a].uart.mux_total = 0;
      pmVar1[0x1b].name[0] = 'J';
      pmVar1[0x1b].name[1] = '1';
      pmVar1[0x1b].name[2] = '8';
      pmVar1[0x1b].name[3] = '-';
      pmVar1[0x1b].name[4] = '1';
      pmVar1[0x1b].name[5] = '4';
      pmVar1[0x1b].name[6] = '\0';
      pmVar1[0x1b].name[7] = '\0';
      *(undefined1 *)&b->pins[0x1b].capabilities = 1;
      pmVar1 = b->pins;
      pmVar1[0x1c].name[0] = 'J';
      pmVar1[0x1c].name[1] = '1';
      pmVar1[0x1c].name[2] = '9';
      pmVar1[0x1c].name[3] = '-';
      pmVar1[0x1c].name[4] = '1';
      pmVar1[0x1c].name[5] = '\0';
      pmVar1[0x1c].name[6] = '\0';
      pmVar1[0x1c].name[7] = '\0';
      *(undefined1 *)&b->pins[0x1c].capabilities = 1;
      pmVar1 = b->pins;
      pmVar1[0x1d].name[0] = 'J';
      pmVar1[0x1d].name[1] = '1';
      pmVar1[0x1d].name[2] = '9';
      pmVar1[0x1d].name[3] = '-';
      pmVar1[0x1d].name[4] = '2';
      pmVar1[0x1d].name[5] = '\0';
      pmVar1[0x1d].name[6] = '\0';
      pmVar1[0x1d].name[7] = '\0';
      *(undefined1 *)&b->pins[0x1d].capabilities = 1;
      pmVar1 = b->pins;
      pmVar1[0x1e].name[0] = 'J';
      pmVar1[0x1e].name[1] = '1';
      pmVar1[0x1e].name[2] = '9';
      pmVar1[0x1e].name[3] = '-';
      pmVar1[0x1e].name[4] = '3';
      pmVar1[0x1e].name[5] = '\0';
      pmVar1[0x1e].name[6] = '\0';
      pmVar1[0x1e].name[7] = '\0';
      *(undefined1 *)&b->pins[0x1e].capabilities = 1;
      pmVar1 = b->pins;
      pmVar1[0x1f].name[0] = 'J';
      pmVar1[0x1f].name[1] = '1';
      pmVar1[0x1f].name[2] = '9';
      pmVar1[0x1f].name[3] = '-';
      pmVar1[0x1f].name[4] = '4';
      pmVar1[0x1f].name[5] = '\0';
      pmVar1[0x1f].name[6] = '\0';
      pmVar1[0x1f].name[7] = '\0';
      *(undefined1 *)&b->pins[0x1f].capabilities = 3;
      pmVar1 = b->pins;
      pmVar1[0x1f].gpio.pinmap = 0x2c;
      pmVar1[0x1f].gpio.mux_total = 0;
      pmVar1[0x20].name[0] = 'J';
      pmVar1[0x20].name[1] = '1';
      pmVar1[0x20].name[2] = '9';
      pmVar1[0x20].name[3] = '-';
      pmVar1[0x20].name[4] = '5';
      pmVar1[0x20].name[5] = '\0';
      pmVar1[0x20].name[6] = '\0';
      pmVar1[0x20].name[7] = '\0';
      *(undefined1 *)&b->pins[0x20].capabilities = 3;
      pmVar1 = b->pins;
      pmVar1[0x20].gpio.pinmap = 0x2e;
      pmVar1[0x20].gpio.mux_total = 0;
      pmVar1[0x21].name[0] = 'J';
      pmVar1[0x21].name[1] = '1';
      pmVar1[0x21].name[2] = '9';
      pmVar1[0x21].name[3] = '-';
      pmVar1[0x21].name[4] = '6';
      pmVar1[0x21].name[5] = '\0';
      pmVar1[0x21].name[6] = '\0';
      pmVar1[0x21].name[7] = '\0';
      *(undefined1 *)&b->pins[0x21].capabilities = 3;
      pmVar1 = b->pins;
      pmVar1[0x21].gpio.pinmap = 0x30;
      pmVar1[0x21].gpio.mux_total = 0;
      pmVar1[0x22].name[0] = 'J';
      pmVar1[0x22].name[1] = '1';
      pmVar1[0x22].name[2] = '9';
      pmVar1[0x22].name[3] = '-';
      pmVar1[0x22].name[4] = '7';
      pmVar1[0x22].name[5] = '\0';
      pmVar1[0x22].name[6] = '\0';
      pmVar1[0x22].name[7] = '\0';
      *(undefined1 *)&b->pins[0x22].capabilities = 1;
      pmVar1 = b->pins;
      pmVar1[0x23].name[0] = 'J';
      pmVar1[0x23].name[1] = '1';
      pmVar1[0x23].name[2] = '9';
      pmVar1[0x23].name[3] = '-';
      pmVar1[0x23].name[4] = '8';
      pmVar1[0x23].name[5] = '\0';
      pmVar1[0x23].name[6] = '\0';
      pmVar1[0x23].name[7] = '\0';
      *(undefined1 *)&b->pins[0x23].capabilities = 0x83;
      pmVar1 = b->pins;
      pmVar1[0x23].gpio.pinmap = 0x83;
      pmVar1[0x23].gpio.mux_total = 0;
      pmVar1[0x23].uart.pinmap = 0;
      pmVar1[0x23].uart.parent_id = 0;
      pmVar1[0x23].uart.mux_total = 0;
      pmVar1[0x24].name[0] = 'J';
      pmVar1[0x24].name[1] = '1';
      pmVar1[0x24].name[2] = '9';
      pmVar1[0x24].name[3] = '-';
      pmVar1[0x24].name[4] = '9';
      pmVar1[0x24].name[5] = '\0';
      pmVar1[0x24].name[6] = '\0';
      pmVar1[0x24].name[7] = '\0';
      *(undefined1 *)&b->pins[0x24].capabilities = 3;
      pmVar1 = b->pins;
      pmVar1[0x24].gpio.pinmap = 0xe;
      pmVar1[0x24].gpio.mux_total = 0;
      pmVar1[0x25].name[0] = 'J';
      pmVar1[0x25].name[1] = '1';
      pmVar1[0x25].name[2] = '9';
      pmVar1[0x25].name[3] = '-';
      pmVar1[0x25].name[4] = '1';
      pmVar1[0x25].name[5] = '0';
      pmVar1[0x25].name[6] = '\0';
      pmVar1[0x25].name[7] = '\0';
      *(undefined1 *)&b->pins[0x25].capabilities = 3;
      pmVar1 = b->pins;
      pmVar1[0x25].gpio.pinmap = 0x28;
      pmVar1[0x25].gpio.mux_total = 0;
      pmVar1[0x26].name[0] = 'J';
      pmVar1[0x26].name[1] = '1';
      pmVar1[0x26].name[2] = '9';
      pmVar1[0x26].name[3] = '-';
      pmVar1[0x26].name[4] = '1';
      pmVar1[0x26].name[5] = '1';
      pmVar1[0x26].name[6] = '\0';
      pmVar1[0x26].name[7] = '\0';
      *(undefined1 *)&b->pins[0x26].capabilities = 3;
      pmVar1 = b->pins;
      pmVar1[0x26].gpio.pinmap = 0x2b;
      pmVar1[0x26].gpio.mux_total = 0;
      pmVar1[0x27].name[0] = 'J';
      pmVar1[0x27].name[1] = '1';
      pmVar1[0x27].name[2] = '9';
      pmVar1[0x27].name[3] = '-';
      pmVar1[0x27].name[4] = '1';
      pmVar1[0x27].name[5] = '2';
      pmVar1[0x27].name[6] = '\0';
      pmVar1[0x27].name[7] = '\0';
      *(undefined1 *)&b->pins[0x27].capabilities = 3;
      pmVar1 = b->pins;
      pmVar1[0x27].gpio.pinmap = 0x4d;
      pmVar1[0x27].gpio.mux_total = 0;
      pmVar1[0x28].name[0] = 'J';
      pmVar1[0x28].name[1] = '1';
      pmVar1[0x28].name[2] = '9';
      pmVar1[0x28].name[3] = '-';
      pmVar1[0x28].name[4] = '1';
      pmVar1[0x28].name[5] = '3';
      pmVar1[0x28].name[6] = '\0';
      pmVar1[0x28].name[7] = '\0';
      *(undefined1 *)&b->pins[0x28].capabilities = 3;
      pmVar1 = b->pins;
      pmVar1[0x28].gpio.pinmap = 0x52;
      pmVar1[0x28].gpio.mux_total = 0;
      pmVar1[0x29].name[0] = 'J';
      pmVar1[0x29].name[1] = '1';
      pmVar1[0x29].name[2] = '9';
      pmVar1[0x29].name[3] = '-';
      pmVar1[0x29].name[4] = '1';
      pmVar1[0x29].name[5] = '4';
      pmVar1[0x29].name[6] = '\0';
      pmVar1[0x29].name[7] = '\0';
      *(undefined1 *)&b->pins[0x29].capabilities = 3;
      pmVar1 = b->pins;
      pmVar1[0x29].gpio.pinmap = 0x53;
      pmVar1[0x29].gpio.mux_total = 0;
      pmVar1[0x2a].name[0] = 'J';
      pmVar1[0x2a].name[1] = '2';
      pmVar1[0x2a].name[2] = '0';
      pmVar1[0x2a].name[3] = '-';
      pmVar1[0x2a].name[4] = '1';
      pmVar1[0x2a].name[5] = '\0';
      pmVar1[0x2a].name[6] = '\0';
      pmVar1[0x2a].name[7] = '\0';
      *(undefined1 *)&b->pins[0x2a].capabilities = 1;
      pmVar1 = b->pins;
      pmVar1[0x2b].name[0] = 'J';
      pmVar1[0x2b].name[1] = '2';
      pmVar1[0x2b].name[2] = '0';
      pmVar1[0x2b].name[3] = '-';
      pmVar1[0x2b].name[4] = '2';
      pmVar1[0x2b].name[5] = '\0';
      pmVar1[0x2b].name[6] = '\0';
      pmVar1[0x2b].name[7] = '\0';
      *(undefined1 *)&b->pins[0x2b].capabilities = 1;
      pmVar1 = b->pins;
      pmVar1[0x2c].name[0] = 'J';
      pmVar1[0x2c].name[1] = '2';
      pmVar1[0x2c].name[2] = '0';
      pmVar1[0x2c].name[3] = '-';
      pmVar1[0x2c].name[4] = '3';
      pmVar1[0x2c].name[5] = '\0';
      pmVar1[0x2c].name[6] = '\0';
      pmVar1[0x2c].name[7] = '\0';
      *(undefined1 *)&b->pins[0x2c].capabilities = 1;
      pmVar1 = b->pins;
      pmVar1[0x2d].name[0] = 'J';
      pmVar1[0x2d].name[1] = '2';
      pmVar1[0x2d].name[2] = '0';
      pmVar1[0x2d].name[3] = '-';
      pmVar1[0x2d].name[4] = '4';
      pmVar1[0x2d].name[5] = '\0';
      pmVar1[0x2d].name[6] = '\0';
      pmVar1[0x2d].name[7] = '\0';
      *(undefined1 *)&b->pins[0x2d].capabilities = 3;
      pmVar1 = b->pins;
      pmVar1[0x2d].gpio.pinmap = 0x2d;
      pmVar1[0x2d].gpio.mux_total = 0;
      pmVar1[0x2e].name[0] = 'J';
      pmVar1[0x2e].name[1] = '2';
      pmVar1[0x2e].name[2] = '0';
      pmVar1[0x2e].name[3] = '-';
      pmVar1[0x2e].name[4] = '5';
      pmVar1[0x2e].name[5] = '\0';
      pmVar1[0x2e].name[6] = '\0';
      pmVar1[0x2e].name[7] = '\0';
      *(undefined1 *)&b->pins[0x2e].capabilities = 3;
      pmVar1 = b->pins;
      pmVar1[0x2e].gpio.pinmap = 0x2f;
      pmVar1[0x2e].gpio.mux_total = 0;
      pmVar1[0x2f].name[0] = 'J';
      pmVar1[0x2f].name[1] = '2';
      pmVar1[0x2f].name[2] = '0';
      pmVar1[0x2f].name[3] = '-';
      pmVar1[0x2f].name[4] = '6';
      pmVar1[0x2f].name[5] = '\0';
      pmVar1[0x2f].name[6] = '\0';
      pmVar1[0x2f].name[7] = '\0';
      *(undefined1 *)&b->pins[0x2f].capabilities = 3;
      pmVar1 = b->pins;
      pmVar1[0x2f].gpio.pinmap = 0x31;
      pmVar1[0x2f].gpio.mux_total = 0;
      pmVar1[0x30].name[0] = 'J';
      pmVar1[0x30].name[1] = '2';
      pmVar1[0x30].name[2] = '0';
      pmVar1[0x30].name[3] = '-';
      pmVar1[0x30].name[4] = '7';
      pmVar1[0x30].name[5] = '\0';
      pmVar1[0x30].name[6] = '\0';
      pmVar1[0x30].name[7] = '\0';
      *(undefined1 *)&b->pins[0x30].capabilities = 3;
      pmVar1 = b->pins;
      pmVar1[0x30].gpio.pinmap = 0xf;
      pmVar1[0x30].gpio.mux_total = 0;
      pmVar1[0x31].name[0] = 'J';
      pmVar1[0x31].name[1] = '2';
      pmVar1[0x31].name[2] = '0';
      pmVar1[0x31].name[3] = '-';
      pmVar1[0x31].name[4] = '8';
      pmVar1[0x31].name[5] = '\0';
      pmVar1[0x31].name[6] = '\0';
      pmVar1[0x31].name[7] = '\0';
      *(undefined1 *)&b->pins[0x31].capabilities = 3;
      pmVar1 = b->pins;
      pmVar1[0x31].gpio.pinmap = 0x54;
      pmVar1[0x31].gpio.mux_total = 0;
      pmVar1[0x32].name[0] = 'J';
      pmVar1[0x32].name[1] = '2';
      pmVar1[0x32].name[2] = '0';
      pmVar1[0x32].name[3] = '-';
      pmVar1[0x32].name[4] = '9';
      pmVar1[0x32].name[5] = '\0';
      pmVar1[0x32].name[6] = '\0';
      pmVar1[0x32].name[7] = '\0';
      *(undefined1 *)&b->pins[0x32].capabilities = 3;
      pmVar1 = b->pins;
      pmVar1[0x32].gpio.pinmap = 0x2a;
      pmVar1[0x32].gpio.mux_total = 0;
      pmVar1[0x33].name[0] = 'J';
      pmVar1[0x33].name[1] = '2';
      pmVar1[0x33].name[2] = '0';
      pmVar1[0x33].name[3] = '-';
      pmVar1[0x33].name[4] = '1';
      pmVar1[0x33].name[5] = '0';
      pmVar1[0x33].name[6] = '\0';
      pmVar1[0x33].name[7] = '\0';
      *(undefined1 *)&b->pins[0x33].capabilities = 3;
      pmVar1 = b->pins;
      pmVar1[0x33].gpio.pinmap = 0x29;
      pmVar1[0x33].gpio.mux_total = 0;
      pmVar1[0x34].name[0] = 'J';
      pmVar1[0x34].name[1] = '2';
      pmVar1[0x34].name[2] = '0';
      pmVar1[0x34].name[3] = '-';
      pmVar1[0x34].name[4] = '1';
      pmVar1[0x34].name[5] = '1';
      pmVar1[0x34].name[6] = '\0';
      pmVar1[0x34].name[7] = '\0';
      *(undefined1 *)&b->pins[0x34].capabilities = 3;
      pmVar1 = b->pins;
      pmVar1[0x34].gpio.pinmap = 0x4e;
      pmVar1[0x34].gpio.mux_total = 0;
      pmVar1[0x35].name[0] = 'J';
      pmVar1[0x35].name[1] = '2';
      pmVar1[0x35].name[2] = '0';
      pmVar1[0x35].name[3] = '-';
      pmVar1[0x35].name[4] = '1';
      pmVar1[0x35].name[5] = '2';
      pmVar1[0x35].name[6] = '\0';
      pmVar1[0x35].name[7] = '\0';
      *(undefined1 *)&b->pins[0x35].capabilities = 3;
      pmVar1 = b->pins;
      pmVar1[0x35].gpio.pinmap = 0x4f;
      pmVar1[0x35].gpio.mux_total = 0;
      pmVar1[0x36].name[0] = 'J';
      pmVar1[0x36].name[1] = '2';
      pmVar1[0x36].name[2] = '0';
      pmVar1[0x36].name[3] = '-';
      pmVar1[0x36].name[4] = '1';
      pmVar1[0x36].name[5] = '3';
      pmVar1[0x36].name[6] = '\0';
      pmVar1[0x36].name[7] = '\0';
      *(undefined1 *)&b->pins[0x36].capabilities = 3;
      pmVar1 = b->pins;
      pmVar1[0x36].gpio.pinmap = 0x50;
      pmVar1[0x36].gpio.mux_total = 0;
      pmVar1[0x37].name[0] = 'J';
      pmVar1[0x37].name[1] = '2';
      pmVar1[0x37].name[2] = '0';
      pmVar1[0x37].name[3] = '-';
      pmVar1[0x37].name[4] = '1';
      pmVar1[0x37].name[5] = '4';
      pmVar1[0x37].name[6] = '\0';
      pmVar1[0x37].name[7] = '\0';
      *(undefined1 *)&b->pins[0x37].capabilities = 3;
      pmVar1 = b->pins;
      pmVar1[0x37].gpio.pinmap = 0x51;
      pmVar1[0x37].gpio.mux_total = 0;
      b->i2c_bus_count = 9;
      b->def_i2c_bus = 1;
      lVar3 = 0x20;
      do {
        *(undefined4 *)((long)&((mraa_board_t *)(b->i2c_bus + -1))->phy_pin_count + lVar3) =
             0xffffffff;
        lVar3 = lVar3 + 0x18;
      } while (lVar3 != 0xf8);
      b->i2c_bus[1].bus_id = 1;
      b->i2c_bus[1].scl = 0x13;
      b->i2c_bus[1].sda = 7;
      b->i2c_bus[6].bus_id = 6;
      b->i2c_bus[6].scl = 6;
      b->i2c_bus[6].sda = 8;
      b->spi_bus_count = 1;
      mVar5 = MRAA_SUCCESS;
      b->def_spi_bus = 0;
      b->spi_bus[0].bus_id = 5;
      b->spi_bus[0].slave_s = 1;
      b->spi_bus[0].miso = 0x18;
      b->spi_bus[0].cs = 0x17;
      b->spi_bus[0].sclk = 10;
      b->spi_bus[0].mosi = 0xb;
      b->uart_dev_count = 1;
      b->def_uart_dev = 0;
      b->uart_dev[0].rx = 0x1a;
      b->uart_dev[0].tx = 0x23;
      pcVar4 = "/dev/ttyMFD1";
      if (vanilla_kernel != '\0') {
        pcVar4 = "/dev/ttyS1";
      }
      b->uart_dev[0].device_path = pcVar4;
    }
  }
  return mVar5;
}

Assistant:

mraa_result_t
mraa_intel_edison_miniboard(mraa_board_t* b)
{
    miniboard = 1;
    b->phy_pin_count = 56;
    b->gpio_count = 56; // A bit of a hack I suppose
    b->aio_count = 0;
    b->pwm_default_period = 5000;
    b->pwm_max_period = 218453;
    b->pwm_min_period = 1;

    b->pins = (mraa_pininfo_t*) calloc(b->phy_pin_count, sizeof(mraa_pininfo_t));
    if (b->pins == NULL) {
        return MRAA_ERROR_UNSPECIFIED;
    }

    b->adv_func = (mraa_adv_func_t*) calloc(1, sizeof(mraa_adv_func_t));
    if (b->adv_func == NULL) {
        free(b->pins);
        return MRAA_ERROR_UNSPECIFIED;
    }
    b->adv_func->gpio_init_post = &mraa_intel_edison_gpio_init_post;
    b->adv_func->pwm_init_pre = &mraa_intel_edison_pwm_init_pre;
    b->adv_func->pwm_enable_pre = &mraa_intel_edison_pwm_enable_pre;
    b->adv_func->pwm_write_pre = &mraa_intel_edison_pwm_write_pre;
    b->adv_func->i2c_init_pre = &mraa_intel_edison_i2c_init_pre;
    b->adv_func->i2c_set_frequency_replace = &mraa_intel_edison_i2c_freq;
    b->adv_func->spi_init_pre = &mraa_intel_edison_spi_init_pre;
    b->adv_func->gpio_mode_replace = &mraa_intel_edison_mb_gpio_mode;
    b->adv_func->uart_init_pre = &mraa_intel_edison_uart_init_pre;
    b->adv_func->gpio_mmap_setup = &mraa_intel_edison_mmap_setup;

    int pos = 0;
    strncpy(b->pins[pos].name, "J17-1", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 182;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].pwm.pinmap = 2;
    b->pins[pos].pwm.parent_id = 0;
    b->pins[pos].pwm.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J17-2", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;
    strncpy(b->pins[pos].name, "J17-3", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;
    strncpy(b->pins[pos].name, "J17-4", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;

    strncpy(b->pins[pos].name, "J17-5", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 135;
    b->pins[pos].gpio.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J17-6", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;

    strncpy(b->pins[pos].name, "J17-7", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 1, 0, 0 };
    b->pins[pos].gpio.pinmap = 27;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].i2c.pinmap = 1;
    b->pins[pos].i2c.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J17-8", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 1, 0, 0 };
    b->pins[pos].gpio.pinmap = 20;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].i2c.pinmap = 1;
    b->pins[pos].i2c.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J17-9", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 1, 0, 0 };
    b->pins[pos].gpio.pinmap = 28;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].i2c.pinmap = 1;
    b->pins[pos].i2c.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J17-10", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 1, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 111;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].spi.pinmap = 5;
    b->pins[pos].spi.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J17-11", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 1, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 109;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].spi.pinmap = 5;
    b->pins[pos].spi.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J17-12", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 1, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 115;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].spi.pinmap = 5;
    b->pins[pos].spi.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J17-13", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;

    strncpy(b->pins[pos].name, "J17-14", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 128;
    b->pins[pos].gpio.parent_id = 0;
    b->pins[pos].gpio.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J18-1", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0 , 0};
    b->pins[pos].gpio.pinmap = 13;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].pwm.pinmap = 1;
    b->pins[pos].pwm.parent_id = 0;
    b->pins[pos].pwm.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J18-2", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 165;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J18-3", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;
    strncpy(b->pins[pos].name, "J18-4", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;
    strncpy(b->pins[pos].name, "J18-5", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;

    strncpy(b->pins[pos].name, "J18-6", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 1, 0, 0 };
    b->pins[pos].gpio.pinmap = 19;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].i2c.pinmap = 1;
    b->pins[pos].i2c.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J18-7", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 12;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].pwm.pinmap = 0;
    b->pins[pos].pwm.parent_id = 0;
    b->pins[pos].pwm.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J18-8", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 1, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 183;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].pwm.pinmap = 3;
    b->pins[pos].pwm.parent_id = 0;
    b->pins[pos].pwm.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J18-9", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;

    strncpy(b->pins[pos].name, "J18-10", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 1, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 110;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].spi.pinmap = 5;
    b->pins[pos].spi.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J18-11", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 1, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 114;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].spi.pinmap = 5;
    b->pins[pos].spi.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J18-12", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 129;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J18-13", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 1 };
    b->pins[pos].gpio.pinmap = 130;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].uart.pinmap = 0;
    b->pins[pos].uart.parent_id = 0;
    b->pins[pos].uart.mux_total = 0;

    pos++;
    strncpy(b->pins[pos].name, "J18-14", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;

    strncpy(b->pins[pos].name, "J19-1", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;
    strncpy(b->pins[pos].name, "J19-2", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;
    strncpy(b->pins[pos].name, "J19-3", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;

    strncpy(b->pins[pos].name, "J19-4", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 44;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J19-5", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 46;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J19-6", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 48;
    b->pins[pos].gpio.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J19-7", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;

    strncpy(b->pins[pos].name, "J19-8", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 1 };
    b->pins[pos].gpio.pinmap = 131;
    b->pins[pos].gpio.mux_total = 0;
    b->pins[pos].uart.pinmap = 0;
    b->pins[pos].uart.parent_id = 0;
    b->pins[pos].uart.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J19-9", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 14;
    b->pins[pos].gpio.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J19-10", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 40;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J19-11", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 43;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J19-12", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 77;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J19-13", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 82;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J19-14", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 83;
    b->pins[pos].gpio.mux_total = 0;
    pos++;

    strncpy(b->pins[pos].name, "J20-1", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;
    strncpy(b->pins[pos].name, "J20-2", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;
    strncpy(b->pins[pos].name, "J20-3", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    pos++;
    strncpy(b->pins[pos].name, "J20-4", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 45;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J20-5", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 47;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J20-6", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 49;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J20-7", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 15;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J20-8", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 84;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J20-9", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 42;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J20-10", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 41;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J20-11", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 78;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J20-12", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 79;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J20-13", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 80;
    b->pins[pos].gpio.mux_total = 0;
    pos++;
    strncpy(b->pins[pos].name, "J20-14", 8);
    b->pins[pos].capabilities = (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 };
    b->pins[pos].gpio.pinmap = 81;
    b->pins[pos].gpio.mux_total = 0;
    pos++;

    // BUS DEFINITIONS
    b->i2c_bus_count = 9;
    b->def_i2c_bus = 1;
    int ici;
    for (ici = 0; ici < 9; ici++) {
        b->i2c_bus[ici].bus_id = -1;
    }
    b->i2c_bus[1].bus_id = 1;
    b->i2c_bus[1].sda = 7;
    b->i2c_bus[1].scl = 19;

    b->i2c_bus[6].bus_id = 6;
    b->i2c_bus[6].sda = 8;
    b->i2c_bus[6].scl = 6;

    b->spi_bus_count = 1;
    b->def_spi_bus = 0;
    b->spi_bus[0].bus_id = 5;
    b->spi_bus[0].slave_s = 1;
    b->spi_bus[0].cs = 23;
    b->spi_bus[0].mosi = 11;
    b->spi_bus[0].miso = 24;
    b->spi_bus[0].sclk = 10;

    b->uart_dev_count = 1;
    b->def_uart_dev = 0;
    b->uart_dev[0].rx = 26;
    b->uart_dev[0].tx = 35;
    b->uart_dev[0].device_path = UART_DEV_PATH;

    return MRAA_SUCCESS;
}